

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Arg * kj::_::
      CopyConstructArray_<kj::MainBuilder::Impl::Arg,_kj::MainBuilder::Impl::Arg_*,_true,_false>::
      apply(Arg *pos,Arg *start,Arg *end)

{
  Arg *location;
  Arg *params;
  undefined1 local_30 [8];
  ExceptionGuard guard;
  Arg *end_local;
  Arg *start_local;
  Arg *pos_local;
  
  guard.pos = end;
  ExceptionGuard::ExceptionGuard((ExceptionGuard *)local_30,pos);
  end_local = start;
  while (location = guard.start, end_local != guard.pos) {
    params = mv<kj::MainBuilder::Impl::Arg>(end_local);
    ctor<kj::MainBuilder::Impl::Arg,kj::MainBuilder::Impl::Arg>(location,params);
    guard.start = guard.start + 1;
    end_local = end_local + 1;
  }
  local_30 = (undefined1  [8])guard.start;
  ExceptionGuard::~ExceptionGuard((ExceptionGuard *)local_30);
  return location;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }